

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O2

float point_triangle_distance(Vec3f *x0,Vec3f *x1,Vec3f *x2,Vec3f *x3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vec3f *x2_00;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar18 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  Vec<3U,_float> VVar19;
  float local_d0;
  Vec<3U,_float> local_b0;
  Vec<3U,_float> local_a0;
  Vec<3U,_float> local_90;
  Vec<3U,_float> local_80;
  Vec<3U,_float> local_70;
  Vec<3U,_float> local_60;
  Vec<3U,_float> local_50;
  Vec<3U,_float> local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar18 = in_ZMM0._8_56_;
  VVar19 = Vec<3U,_float>::operator-(x1,x3);
  local_40.v[2] = VVar19.v[2];
  auVar8._0_8_ = VVar19.v._0_8_;
  auVar8._8_56_ = auVar18;
  local_40.v._0_8_ = vmovlps_avx(auVar8._0_16_);
  VVar19 = Vec<3U,_float>::operator-(x2,x3);
  local_50.v[2] = VVar19.v[2];
  auVar9._0_8_ = VVar19.v._0_8_;
  auVar9._8_56_ = auVar18;
  local_50.v._0_8_ = vmovlps_avx(auVar9._0_16_);
  VVar19 = Vec<3U,_float>::operator-(x0,x3);
  local_60.v[2] = VVar19.v[2];
  auVar10._0_8_ = VVar19.v._0_8_;
  auVar10._8_56_ = auVar18;
  local_60.v._0_8_ = vmovlps_avx(auVar10._0_16_);
  fVar3 = mag2<3u,float>(&local_40);
  fVar4 = mag2<3u,float>(&local_50);
  fVar5 = dot<3u,float>(&local_40,&local_50);
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),ZEXT416((uint)fVar4),ZEXT416((uint)fVar3))
  ;
  auVar1 = vmaxss_avx(SUB6416(ZEXT464(0xda24260),0),auVar1);
  fVar6 = 1.0 / auVar1._0_4_;
  fVar7 = dot<3u,float>(&local_40,&local_60);
  auVar11._0_4_ = dot<3u,float>(&local_50,&local_60);
  auVar11._4_60_ = extraout_var;
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar5)),ZEXT416((uint)fVar7),
                           ZEXT416((uint)fVar4));
  auVar2 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar5)),auVar11._0_16_,ZEXT416((uint)fVar3));
  fVar3 = auVar1._0_4_ * fVar6;
  auVar18 = (undefined1  [56])0x0;
  fVar6 = auVar2._0_4_ * fVar6;
  if (((fVar3 < 0.0) || (fVar6 < 0.0)) || (fVar4 = (1.0 - fVar3) - fVar6, fVar4 < 0.0)) {
    if (fVar3 <= 0.0) {
      x2_00 = x3;
      if (0.0 < fVar6) {
        x2_00 = x2;
      }
      local_d0 = point_segment_distance(x0,x1,x2_00);
      x1 = x2;
    }
    else {
      local_d0 = point_segment_distance(x0,x1,x2);
    }
    auVar17._0_4_ = point_segment_distance(x0,x1,x3);
    auVar17._4_60_ = extraout_var_00;
    auVar1 = vminss_avx(auVar17._0_16_,ZEXT416((uint)local_d0));
    fVar3 = auVar1._0_4_;
  }
  else {
    VVar19 = operator*(fVar3,x1);
    local_90.v[2] = VVar19.v[2];
    auVar12._0_8_ = VVar19.v._0_8_;
    auVar12._8_56_ = auVar18;
    local_90.v._0_8_ = vmovlps_avx(auVar12._0_16_);
    auVar18 = (undefined1  [56])0x0;
    VVar19 = operator*(fVar6,x2);
    local_a0.v[2] = VVar19.v[2];
    auVar13._0_8_ = VVar19.v._0_8_;
    auVar13._8_56_ = auVar18;
    local_a0.v._0_8_ = vmovlps_avx(auVar13._0_16_);
    VVar19 = Vec<3U,_float>::operator+(&local_90,&local_a0);
    local_80.v[2] = VVar19.v[2];
    auVar14._0_8_ = VVar19.v._0_8_;
    auVar14._8_56_ = auVar18;
    local_80.v._0_8_ = vmovlps_avx(auVar14._0_16_);
    auVar18 = (undefined1  [56])0x0;
    VVar19 = operator*(fVar4,x3);
    local_b0.v[2] = VVar19.v[2];
    auVar15._0_8_ = VVar19.v._0_8_;
    auVar15._8_56_ = auVar18;
    local_b0.v._0_8_ = vmovlps_avx(auVar15._0_16_);
    VVar19 = Vec<3U,_float>::operator+(&local_80,&local_b0);
    local_70.v[2] = VVar19.v[2];
    auVar16._0_8_ = VVar19.v._0_8_;
    auVar16._8_56_ = auVar18;
    local_70.v._0_8_ = vmovlps_avx(auVar16._0_16_);
    fVar3 = dist<3u,float>(x0,&local_70);
  }
  return fVar3;
}

Assistant:

static float point_triangle_distance(const Vec3f &x0, const Vec3f &x1, const Vec3f &x2,
                                     const Vec3f &x3) {
  // first find barycentric coordinates of closest point on infinite plane
  Vec3f x13(x1 - x3), x23(x2 - x3), x03(x0 - x3);
  float m13 = mag2(x13), m23 = mag2(x23), d = dot(x13, x23);
  float invdet = 1.f / max(m13 * m23 - d * d, 1e-30f);
  float a = dot(x13, x03), b = dot(x23, x03);
  // the barycentric coordinates themselves
  float w23 = invdet * (m23 * a - d * b);
  float w31 = invdet * (m13 * b - d * a);
  float w12 = 1 - w23 - w31;
  if (w23 >= 0 && w31 >= 0 && w12 >= 0) {  // if we're inside the triangle
    return dist(x0, w23 * x1 + w31 * x2 + w12 * x3);
  } else {        // we have to clamp to one of the edges
    if (w23 > 0)  // this rules out edge 2-3 for us
      return min(point_segment_distance(x0, x1, x2), point_segment_distance(x0, x1, x3));
    else if (w31 > 0)  // this rules out edge 1-3
      return min(point_segment_distance(x0, x1, x2), point_segment_distance(x0, x2, x3));
    else  // w12 must be >0, ruling out edge 1-2
      return min(point_segment_distance(x0, x1, x3), point_segment_distance(x0, x2, x3));
  }
}